

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

DispatchCallResult __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *actualInterfaceName,uint64_t requestedTypeId)

{
  undefined8 extraout_RDX;
  unsigned_long *in_R9;
  DispatchCallResult DVar1;
  String local_1d0;
  Exception local_1b8;
  char *local_28;
  uint64_t requestedTypeId_local;
  char *actualInterfaceName_local;
  Server *this_local;
  
  requestedTypeId_local = requestedTypeId;
  actualInterfaceName_local = actualInterfaceName;
  this_local = this;
  kj::_::Debug::makeDescription<char_const(&)[37],char_const*&,unsigned_long&>
            (&local_1d0,
             (Debug *)
             "\"Requested interface not implemented.\", actualInterfaceName, requestedTypeId",
             "Requested interface not implemented.",(char (*) [37])&requestedTypeId_local,&local_28,
             in_R9);
  kj::Exception::Exception
            (&local_1b8,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x5c,&local_1d0);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_1b8);
  *(undefined1 *)&(this->thisHook).ptr = 0;
  *(undefined1 *)((long)&(this->thisHook).ptr + 1) = 1;
  kj::Exception::~Exception(&local_1b8);
  kj::String::~String(&local_1d0);
  DVar1.isStreaming = (bool)(char)extraout_RDX;
  DVar1.allowCancellation = (bool)(char)((ulong)extraout_RDX >> 8);
  DVar1._10_6_ = (int6)((ulong)extraout_RDX >> 0x10);
  DVar1.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar1;
}

Assistant:

Capability::Server::DispatchCallResult Capability::Server::internalUnimplemented(
    const char* actualInterfaceName, uint64_t requestedTypeId) {
  return {
    KJ_EXCEPTION(UNIMPLEMENTED, "Requested interface not implemented.",
                 actualInterfaceName, requestedTypeId),
    false, true
  };
}